

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_matrix.c
# Opt level: O1

int gdAffineShearHorizontal(double *dst,double angle)

{
  double dVar1;
  
  *dst = 1.0;
  dst[1] = 0.0;
  dVar1 = tan((angle * 3.141592653589793) / 180.0);
  dst[2] = dVar1;
  dst[3] = 1.0;
  dst[4] = 0.0;
  dst[5] = 0.0;
  return 1;
}

Assistant:

BGD_DECLARE(int) gdAffineShearHorizontal(double dst[6], const double angle)
{
	dst[0] = 1;
	dst[1] = 0;
	dst[2] = tan(angle * M_PI / 180.0);
	dst[3] = 1;
	dst[4] = 0;
	dst[5] = 0;
  	return GD_TRUE;
}